

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object_State_Header.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Object_State_Header::Encode(Object_State_Header *this,KDataStream *stream)

{
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_ObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_ObjID,stream);
  (*(this->m_RefObjID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_RefObjID,stream);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16UpdateNum);
  KDataStream::Write(stream,this->m_ui8ForceID);
  return;
}

Assistant:

void Object_State_Header::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_ObjID
           << KDIS_STREAM m_RefObjID
           << m_ui16UpdateNum
           << m_ui8ForceID;
}